

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O0

void IntraChromaPreds_SSE2(uint8_t *dst,uint8_t *left,uint8_t *top)

{
  uint8_t *in_RDX;
  uint8_t *in_RSI;
  uint8_t *in_RDI;
  
  DC8uvMode_SSE2(in_RSI,in_RDX,(uint8_t *)0x16c42c);
  VerticalPred_SSE2(in_RSI,in_RDX,0);
  HorizontalPred_SSE2(in_RSI,in_RDX,0);
  TrueMotion_SSE2(top,in_RDI,in_RSI,(int)((ulong)in_RDX >> 0x20));
  in_RDI = in_RDI + 8;
  if (in_RDX != (uint8_t *)0x0) {
    in_RDX = in_RDX + 8;
  }
  if (in_RSI != (uint8_t *)0x0) {
    in_RSI = in_RSI + 0x10;
  }
  DC8uvMode_SSE2(in_RSI,in_RDX,(uint8_t *)0x16c4d1);
  VerticalPred_SSE2(in_RSI,in_RDX,0);
  HorizontalPred_SSE2(in_RSI,in_RDX,0);
  TrueMotion_SSE2(top,in_RDI,in_RSI,(int)((ulong)in_RDX >> 0x20));
  return;
}

Assistant:

static void IntraChromaPreds_SSE2(uint8_t* dst, const uint8_t* left,
                                  const uint8_t* top) {
  // U block
  DC8uvMode_SSE2(C8DC8 + dst, left, top);
  VerticalPred_SSE2(C8VE8 + dst, top, 8);
  HorizontalPred_SSE2(C8HE8 + dst, left, 8);
  TrueMotion_SSE2(C8TM8 + dst, left, top, 8);
  // V block
  dst += 8;
  if (top != NULL) top += 8;
  if (left != NULL) left += 16;
  DC8uvMode_SSE2(C8DC8 + dst, left, top);
  VerticalPred_SSE2(C8VE8 + dst, top, 8);
  HorizontalPred_SSE2(C8HE8 + dst, left, 8);
  TrueMotion_SSE2(C8TM8 + dst, left, top, 8);
}